

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateMergeFromCodedStreamWithPacking
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldOptions *this_00;
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  this_00 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(this_00);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "::google::protobuf::uint32 length;\nDO_(input->ReadVarint32(&length));\n::google::protobuf::io::CodedInputStream::Limit limit = input->PushLimit(length);\nwhile (input->BytesUntilLimit() > 0) {\n  int value;\n  DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n       input, &value)));\n  if ($type$_IsValid(value)) {\n    add_$name$(static_cast< $type$ >(value));\n  }\n}\ninput->PopLimit(limit);\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "DO_((::google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline(\n       input,\n       &$type$_IsValid,\n       this->mutable_$name$())));\n"
                      );
  }
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateMergeFromCodedStreamWithPacking(io::Printer* printer) const {
  if (!descriptor_->options().packed()) {
    // We use a non-inlined implementation in this case, since this path will
    // rarely be executed.
    printer->Print(variables_,
      "DO_((::google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline(\n"
      "       input,\n"
      "       &$type$_IsValid,\n"
      "       this->mutable_$name$())));\n");
  } else {
    printer->Print(variables_,
      "::google::protobuf::uint32 length;\n"
      "DO_(input->ReadVarint32(&length));\n"
      "::google::protobuf::io::CodedInputStream::Limit limit = "
          "input->PushLimit(length);\n"
      "while (input->BytesUntilLimit() > 0) {\n"
      "  int value;\n"
      "  DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n"
      "         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n"
      "       input, &value)));\n"
      "  if ($type$_IsValid(value)) {\n"
      "    add_$name$(static_cast< $type$ >(value));\n"
      "  }\n"
      "}\n"
      "input->PopLimit(limit);\n");
  }
}